

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric_input.cpp
# Opt level: O0

Reals __thiscall
Omega_h::get_variation_metrics(Omega_h *this,Mesh *mesh,Real knob,Int dim,Int ncomps,Reals *data)

{
  void **this_00;
  LO LVar1;
  Int IVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar3;
  Reals RVar4;
  Read<double> local_170;
  Read<double> local_160;
  Read<double> local_150;
  Read<double> local_140;
  undefined1 local_130 [8];
  Reals comp_metrics;
  undefined1 local_110 [8];
  Read<double> comp_data;
  Int comp;
  Read<double> local_e8;
  undefined1 local_d8 [8];
  Reals vert_grads;
  undefined1 local_b8 [8];
  Reals vert_data;
  Read<double> local_88;
  undefined1 local_78 [8];
  Reals hessians;
  Reals *data_local;
  Int ncomps_local;
  Int dim_local;
  Real knob_local;
  Mesh *mesh_local;
  Reals *metrics;
  ulong local_20;
  
  if (((ulong)(data->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((data->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(data->write_).shared_alloc_.alloc >> 3;
  }
  hessians.write_.shared_alloc_.direct_ptr = data;
  LVar1 = Mesh::nents(mesh,dim);
  if ((int)(local_20 >> 3) == LVar1 * ncomps) {
    if (ncomps == 1) {
      if (dim == 0) {
        Read<double>::Read(&local_88,data);
        recover_hessians((Omega_h *)local_78,mesh,&local_88);
        Read<double>::~Read(&local_88);
        IVar2 = Mesh::dim(mesh);
        Read<double>::Read((Read<double> *)&vert_data.write_.shared_alloc_.direct_ptr,
                           (Read<double> *)local_78);
        get_hessian_metrics(this,IVar2,(Reals *)&vert_data.write_.shared_alloc_.direct_ptr,knob);
        Read<double>::~Read((Read<double> *)&vert_data.write_.shared_alloc_.direct_ptr);
        Read<double>::~Read((Read<double> *)local_78);
        pvVar3 = extraout_RDX_00;
      }
      else {
        IVar2 = Mesh::dim(mesh);
        if (dim != IVar2) {
          fail("assertion %s failed at %s +%d\n","false",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric_input.cpp"
               ,0x42);
        }
        this_00 = &vert_grads.write_.shared_alloc_.direct_ptr;
        Read<double>::Read((Read<double> *)this_00,data);
        project_by_fit((Omega_h *)local_b8,mesh,(Reals *)this_00);
        Read<double>::~Read((Read<double> *)&vert_grads.write_.shared_alloc_.direct_ptr);
        Read<double>::Read(&local_e8,(Read<double> *)local_b8);
        recover_gradients((Omega_h *)local_d8,mesh,&local_e8);
        Read<double>::~Read(&local_e8);
        IVar2 = Mesh::dim(mesh);
        Read<double>::Read((Read<double> *)&comp,(Read<double> *)local_d8);
        get_gradient_metrics(this,IVar2,(Reals *)&comp,knob);
        Read<double>::~Read((Read<double> *)&comp);
        Read<double>::~Read((Read<double> *)local_d8);
        Read<double>::~Read((Read<double> *)local_b8);
        pvVar3 = extraout_RDX_01;
      }
    }
    else {
      comp_data.write_.shared_alloc_.direct_ptr._7_1_ = 0;
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      pvVar3 = extraout_RDX;
      for (comp_data.write_.shared_alloc_.direct_ptr._0_4_ = 0;
          (int)comp_data.write_.shared_alloc_.direct_ptr < ncomps;
          comp_data.write_.shared_alloc_.direct_ptr._0_4_ =
               (int)comp_data.write_.shared_alloc_.direct_ptr + 1) {
        Read<double>::Read((Read<double> *)&comp_metrics.write_.shared_alloc_.direct_ptr,data);
        get_component<double>
                  ((Omega_h *)local_110,
                   (Read<double> *)&comp_metrics.write_.shared_alloc_.direct_ptr,ncomps,
                   (int)comp_data.write_.shared_alloc_.direct_ptr);
        Read<double>::~Read((Read<double> *)&comp_metrics.write_.shared_alloc_.direct_ptr);
        Read<double>::Read(&local_140,(Read<double> *)local_110);
        get_variation_metrics((Omega_h *)local_130,mesh,knob,dim,1,&local_140);
        Read<double>::~Read(&local_140);
        if ((int)comp_data.write_.shared_alloc_.direct_ptr == 0) {
          Read<double>::operator=((Read<double> *)this,(Read<double> *)local_130);
        }
        else {
          LVar1 = Mesh::nverts(mesh);
          Read<double>::Read(&local_160,(Read<double> *)this);
          Read<double>::Read(&local_170,(Read<double> *)local_130);
          intersect_metrics((Omega_h *)&local_150,LVar1,&local_160,&local_170);
          Read<double>::operator=((Read<double> *)this,&local_150);
          Read<double>::~Read(&local_150);
          Read<double>::~Read(&local_170);
          Read<double>::~Read(&local_160);
        }
        Read<double>::~Read((Read<double> *)local_130);
        Read<double>::~Read((Read<double> *)local_110);
        pvVar3 = extraout_RDX_02;
      }
    }
    RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
    RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar4.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","data.size() == mesh->nents(dim) * ncomps",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric_input.cpp"
       ,0x2b);
}

Assistant:

static Reals get_variation_metrics(
    Mesh* mesh, Real knob, Int dim, Int ncomps, Reals data) {
  OMEGA_H_CHECK(data.size() == mesh->nents(dim) * ncomps);
  if (ncomps == 1) {
    if (dim == VERT) {
      auto hessians = recover_hessians(mesh, data);
      return get_hessian_metrics(mesh->dim(), hessians, knob);
    } else if (dim == mesh->dim()) {
      auto vert_data = project_by_fit(mesh, data);
      auto vert_grads = recover_gradients(mesh, vert_data);
      return get_gradient_metrics(mesh->dim(), vert_grads, knob);
    }
  } else {
    Reals metrics;
    for (Int comp = 0; comp < ncomps; ++comp) {
      auto comp_data = get_component(data, ncomps, comp);
      auto comp_metrics = get_variation_metrics(mesh, knob, dim, 1, comp_data);
      if (comp) {
        metrics = intersect_metrics(mesh->nverts(), metrics, comp_metrics);
      } else {
        metrics = comp_metrics;
      }
    }
    return metrics;
  }
  OMEGA_H_NORETURN(Reals());
}